

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

void __thiscall Cholesky_solve_Test::TestBody(Cholesky_solve_Test *this)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar12;
  CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *pCVar13;
  char *pcVar14;
  long lVar15;
  float *rhs;
  float fVar16;
  float fVar17;
  undefined1 local_1a8 [8];
  Matrix<T,_4,_3> P;
  undefined1 local_16c [8];
  Matrix<T,_3,_3> S_;
  Matrix<T,_4,_3> P_;
  Scalar local_110;
  Scalar local_10c;
  Scalar local_108;
  Scalar local_104;
  long local_100;
  undefined1 auStack_f8 [8];
  AssertionResult gtest_ar;
  Scalar local_a8;
  undefined1 auStack_a4 [4];
  Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> S;
  undefined8 local_70;
  DenseMatrixType res;
  Scalar local_44;
  Scalar local_40;
  Scalar local_3c;
  AssertHelper local_38;
  
  auStack_f8 = (undefined1  [8])local_16c;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_16c._0_4_ = 1.0;
  local_a8 = 0.0;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)auStack_f8,
                       &local_a8);
  S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar12,S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array + 7);
  local_70._0_4_ = 1.0;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar12,(Scalar *)&local_70);
  local_38.data_._0_4_ = 0x3f800000;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar12,(Scalar *)&local_38);
  res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar12,res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 8);
  local_44 = 1.0;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar12,&local_44);
  local_40 = 1.0;
  pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar12,&local_40);
  local_3c = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar12,&local_3c);
  if ((gtest_ar._0_8_ == 2) &&
     (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3)) {
    local_a8 = (Scalar)local_16c._0_4_;
    _auStack_a4 = stack0xfffffffffffffe98;
    S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
    S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3];
    S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
         S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
    S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]._0_1_ =
         '\x01';
    auStack_f8 = (undefined1  [8])local_1a8;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    local_1a8._0_4_ = 6.0;
    S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 4.0;
    S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ = auStack_f8;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)auStack_f8,
                         S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array + 7);
    local_70._0_4_ = 2.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,(Scalar *)&local_70);
    local_38.data_._0_4_ = 0x40800000;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,(Scalar *)&local_38);
    res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 8.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.
                                 m_storage.m_data.array + 8);
    local_44 = 6.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,&local_44);
    local_40 = 2.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,&local_40);
    local_3c = 6.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,&local_3c);
    local_110 = 0.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,&local_110);
    local_10c = 3.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,&local_10c);
    local_108 = 5.0;
    pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar13,&local_108);
    local_104 = 7.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_(pCVar13,&local_104);
    if ((gtest_ar._0_8_ == 3) &&
       (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3)) {
      S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ =
           local_1a8;
      if (S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
          super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8].
          _0_1_ == '\0') {
        __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                      "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                      "void Eigen::SolverBase<Eigen::LLT<Eigen::Matrix<float, 3, 3>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::LLT<Eigen::Matrix<float, 3, 3>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float, 4, 3>>>]"
                     );
      }
      auStack_f8 = (undefined1  [8])&gtest_ar.message_;
      rhs = S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
            7;
      Eigen::LLT<Eigen::Matrix<float,3,3,0,3,3>,1>::
      _solve_impl_transposed<true,Eigen::Transpose<Eigen::Matrix<float,4,3,0,4,3>>,Eigen::Matrix<float,3,4,1,3,4>>
                ((LLT<Eigen::Matrix<float,3,3,0,3,3>,1> *)&local_a8,
                 (Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)rhs,
                 (Matrix<float,_3,_4,_1,_3,_4> *)auStack_f8);
      if (S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
          super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8].
          _0_1_ != '\0') {
        ppbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)auStack_f8;
        fVar17 = *(float *)((long)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)auStack_f8 + 4);
        pfVar1 = (float *)((long)auStack_f8 + 8);
        lVar15 = (long)auStack_f8 + 8;
        fVar2 = *(float *)((long)auStack_f8 + 0x10);
        fVar3 = *(float *)((long)auStack_f8 + 0x10 + 4);
        pfVar4 = (float *)((long)auStack_f8 + 0x18);
        lVar9 = (long)auStack_f8 + 0x18;
        fVar5 = *(float *)((long)auStack_f8 + 0x20);
        fVar6 = *(float *)((long)auStack_f8 + 0x20 + 4);
        pfVar7 = (float *)((long)auStack_f8 + 0x28);
        lVar10 = (long)auStack_f8 + 0x28;
        res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             0.0;
        res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
             0.0;
        res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
             0.0;
        local_70._4_4_ = auStack_a4;
        local_70._0_4_ = local_a8;
        res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
        res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
        res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
             S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3];
        res.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
             S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
        auStack_f8._0_4_ =
             fVar5 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[0] + fVar2 * (float)auStack_a4 + *(float *)ppbVar8 * local_a8;
        auStack_f8._4_4_ =
             fVar6 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[0] + fVar3 * (float)auStack_a4 + fVar17 * local_a8;
        gtest_ar._4_4_ =
             *(float *)(lVar10 + 4) *
             S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] +
             *(float *)(lVar9 + 4) * (float)auStack_a4 + *(float *)(lVar15 + 4) * local_a8;
        gtest_ar._0_4_ =
             *pfVar7 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                       array[0] + *pfVar4 * (float)auStack_a4 + *pfVar1 * local_a8;
        fVar16 = *(float *)ppbVar8 * 0.0;
        fVar17 = fVar17 * 0.0;
        gtest_ar.message_.ptr_._0_4_ =
             fVar5 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[3] +
             fVar2 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[2] + fVar16;
        gtest_ar.message_.ptr_._4_4_ =
             fVar6 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[3] +
             fVar3 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[2] + fVar17;
        S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
             gtest_ar.message_.ptr_._4_4_ * 0.0 + local_a8 * (float)auStack_f8._4_4_ +
             (fVar6 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[6] + fVar3 * 0.0 + fVar17) * 0.0;
        S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
             gtest_ar.message_.ptr_._0_4_ * 0.0 + local_a8 * (float)auStack_f8._0_4_ +
             (fVar5 * S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[6] + fVar2 * 0.0 + fVar16) * 0.0;
        local_100 = 0;
        do {
          lVar15 = 0;
          do {
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)auStack_f8,"P(i,j)","P_(i,j)",
                       *(float *)(S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ +
                                 lVar15),*(float *)((long)rhs + lVar15));
            if (auStack_f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_70);
              if (gtest_ar._0_8_ == 0) {
                pcVar14 = "";
              }
              else {
                pcVar14 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/Matrix.cpp"
                         ,0x23,pcVar14);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              if (local_70 !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar11 = testing::internal::IsTrue(true);
                if ((bVar11) &&
                   (local_70 !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_70 + 8))();
                }
                local_70 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              return;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            lVar15 = lVar15 + 0x10;
          } while (lVar15 != 0x30);
          local_100 = local_100 + 1;
          S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ =
               S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ + 4;
          rhs = rhs + 1;
        } while (local_100 != 4);
        return;
      }
      __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/Cholesky/LLT.h",0x89,
                    "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<float, 3, 3>>::matrixL() const [MatrixType = Eigen::Matrix<float, 3, 3>, UpLo = 1]"
                   );
    }
    pcVar14 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 4, 3>>::finished() [MatrixType = Eigen::Matrix<float, 4, 3>]"
    ;
  }
  else {
    pcVar14 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar14);
}

Assistant:

TEST(Cholesky, solve) {
    Matrix<T, 4, 3> K;
    Matrix<T, 4, 3> P;
    
    // Set S (lower choleksy factor)
    Matrix<T,3,3> S_;
    S_ << 1, 0, 0, 1, 1, 0, 1, 1, 2;
    
    Cholesky<Matrix<T,3,3>> S;
    S.setL(S_);
    
    // Set P
    P << 6, 4, 2, 4, 8, 6, 2, 6, 0, 3, 5, 7;
    
    // Compute K
    K = S.solve(P.transpose()).transpose();

    Matrix<T, 4, 3> P_ = K * S.matrixL().toDenseMatrix() * S.matrixU().toDenseMatrix();
    
    for(int i = 0; i < 4; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            ASSERT_FLOAT_EQ( P(i,j), P_(i,j) );
        }
    }
}